

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sbcd_8_rr(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar2 = *(uint *)((long)m68ki_cpu.dar + uVar3);
  iVar7 = (uVar2 & 0xf) - (m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xf);
  iVar5 = (int)(m68ki_cpu.x_flag << 0x17) >> 0x1f;
  uVar1 = iVar5 + iVar7;
  uVar6 = iVar5 + -6 + iVar7;
  if (uVar1 < 10) {
    uVar6 = uVar1;
  }
  iVar5 = (uVar2 & 0xf0) - (m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xf0);
  uVar4 = uVar6 + iVar5;
  uVar6 = uVar6 + 0xa0 + iVar5;
  if (0x99 >= uVar4) {
    uVar6 = uVar4;
  }
  m68ki_cpu.x_flag = (uint)(0x99 < uVar4) << 8;
  m68ki_cpu.n_flag = uVar6 & 0xff;
  m68ki_cpu.v_flag = ~uVar1 & m68ki_cpu.n_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | m68ki_cpu.n_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar3) = uVar2 & 0xffffff00 | m68ki_cpu.n_flag;
  return;
}

Assistant:

static void m68k_op_sbcd_8_rr(void)
{
	uint* r_dst = &DX;
	uint src = DY;
	uint dst = *r_dst;
	uint res = LOW_NIBBLE(dst) - LOW_NIBBLE(src) - XFLAG_AS_1();

	FLAG_V = ~res; /* Undefined V behavior */

	if(res > 9)
		res -= 6;
	res += HIGH_NIBBLE(dst) - HIGH_NIBBLE(src);
	FLAG_X = FLAG_C = (res > 0x99) << 8;
	if(FLAG_C)
		res += 0xa0;

	res = MASK_OUT_ABOVE_8(res);

	FLAG_V &= res; /* Undefined V behavior part II */
	FLAG_N = NFLAG_8(res); /* Undefined N behavior */
	FLAG_Z |= res;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;
}